

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bandit_run_policy.h
# Opt level: O1

bool __thiscall
bandit::detail::bandit_run_policy::should_run
          (bandit_run_policy *this,char *it_name,contextstack_t *contexts)

{
  size_type sVar1;
  size_type sVar2;
  bool bVar3;
  int iVar4;
  
  if ((this->dry_run_ != false) ||
     (((this->break_on_failure_ == true &&
       (iVar4 = (*(this->super_run_policy)._vptr_run_policy[4])(this), (char)iVar4 != '\0')) ||
      (bVar3 = has_context_with_hard_skip(this,contexts), bVar3)))) {
LAB_00112586:
    bVar3 = false;
  }
  else {
    sVar1 = (this->skip_pattern_)._M_string_length;
    if ((this->only_pattern_)._M_string_length == 0 && sVar1 == 0) {
      return true;
    }
    sVar2 = (this->only_pattern_)._M_string_length;
    if (sVar2 != 0 && sVar1 == 0) {
      bVar3 = context_matches_only_pattern(this,contexts);
      if (bVar3) {
        return true;
      }
LAB_0011260c:
      bVar3 = matches_only_pattern(this,it_name);
      return bVar3;
    }
    if (sVar1 == 0 || sVar2 != 0) {
      bVar3 = context_matches_only_pattern(this,contexts);
      if (!bVar3) goto LAB_0011260c;
    }
    else {
      bVar3 = context_matches_skip_pattern(this,contexts);
      if (bVar3) goto LAB_00112586;
    }
    bVar3 = matches_skip_pattern(this,it_name);
    bVar3 = !bVar3;
  }
  return bVar3;
}

Assistant:

bool should_run(const char* it_name, const contextstack_t& contexts) const
    {
      if(dry_run_)
      {
          return false;
      }

      if(break_on_failure_ && has_encountered_failure())
      {
          return false;
      }

      //
      // Never run if a context has been marked as skip
      // using 'describe_skip'
      //
      if(has_context_with_hard_skip(contexts))
      {
        return false;
      }

      //
      // Always run if no patterns have been specifed
      //
      if(!has_skip_pattern() && !has_only_pattern())
      {
        return true;
      }

      if(has_only_pattern() && !has_skip_pattern())
      {
        return context_matches_only_pattern(contexts)
          || matches_only_pattern(it_name);
      }

      if(has_skip_pattern() && !has_only_pattern())
      {
        bool skip = context_matches_skip_pattern(contexts) ||
          matches_skip_pattern(it_name);
        return !skip;
      }

      //
      // If we've come this far, both 'skip' and 'only'
      // have been specified.
      //
      // If our contexts match 'only' we're still good
      // regardless of whether there's a 'skip' somewhere
      // in the context stack as well.
      if(context_matches_only_pattern(contexts))
      {
        //
        // We can still mark the current 'it' as 'skip'
        // and ignore it. We check that here.
        //
        return !matches_skip_pattern(it_name);
      }

      //
      // If we've gotten this far, the context matches 'skip'
      // We can still run this spec if it is specifically marked
      // as 'only'.
      //
      return matches_only_pattern(it_name);
    }